

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pztransfer.cpp
# Opt level: O0

void __thiscall
TPZTransfer<std::complex<float>_>::ExpandColumnVectorEntries
          (TPZTransfer<std::complex<float>_> *this,int num)

{
  int iVar1;
  int64_t iVar2;
  int in_ESI;
  long in_RDI;
  TPZManVector<int,_10> *unaff_retaddr;
  int64_t in_stack_00000008;
  TPZManVector<int,_10> *in_stack_00000010;
  int nextsize;
  int *in_stack_00000028;
  TPZVec<int> *in_stack_00000030;
  long newsize;
  
  newsize = in_RDI;
  while( true ) {
    iVar1 = *(int *)(in_RDI + 0x290);
    iVar2 = TPZVec<int>::NAlloc((TPZVec<int> *)(in_RDI + 0x248));
    if (iVar1 + in_ESI <= iVar2) break;
    TPZVec<int>::NAlloc((TPZVec<int> *)(in_RDI + 0x248));
    TPZManVector<int,_10>::Expand(unaff_retaddr,newsize);
    TPZManVector<int,_10>::Expand(unaff_retaddr,newsize);
  }
  TPZManVector<int,_10>::Resize(in_stack_00000010,in_stack_00000008);
  TPZVec<int>::Fill(in_stack_00000030,in_stack_00000028,(int64_t)this,CONCAT44(num,nextsize));
  TPZManVector<int,_10>::Resize(in_stack_00000010,in_stack_00000008);
  TPZVec<int>::Fill(in_stack_00000030,in_stack_00000028,(int64_t)this,CONCAT44(num,nextsize));
  return;
}

Assistant:

void TPZTransfer<TVar>::ExpandColumnVectorEntries(int num){
	while(fColumnBlockLastUsed+num > fColumnBlockNumber.NAlloc()) {
		int nextsize = fColumnBlockNumber.NAlloc()+1000;
		fColumnBlockNumber.Expand(nextsize);
		fColumnBlockPosition.Expand(nextsize);
	}
	fColumnBlockNumber.Resize(fColumnBlockLastUsed+num);
	fColumnBlockNumber.Fill(-1,fColumnBlockLastUsed);
	fColumnBlockPosition.Resize(fColumnBlockLastUsed+num);
	fColumnBlockPosition.Fill(0,fColumnBlockLastUsed);
}